

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O1

void __thiscall
Hydro::MacProjector::setDivU
          (MacProjector *this,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_divu)

{
  pointer pMVar1;
  pointer ppMVar2;
  MultiFab *pMVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  undefined8 local_58;
  undefined8 uStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (this->m_linop == (MLLinOp *)0x0) {
    amrex::Assert_host("m_linop != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/Projections/hydro_MacProjector.cpp"
                       ,0xae,
                       "\"MacProjector::setDivU: initProjector must be called before calling this method\""
                      );
  }
  uVar6 = (uint)((ulong)((long)(a_divu->
                               super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                               ).
                               super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(a_divu->
                              super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              ).
                              super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar6) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      if ((a_divu->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5] != (MultiFab *)0x0) {
        bVar4 = amrex::FabArray<amrex::FArrayBox>::ok
                          ((FabArray<amrex::FArrayBox> *)
                           ((long)&(((this->m_divu).
                                     super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                     .
                                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar7));
        if (!bVar4) {
          pMVar1 = (this->m_divu).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ppMVar2 = (a_divu->
                    super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>)
                    .
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar3 = ppMVar2[uVar5];
          local_58 = 1;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uStack_50 = 0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (**(code **)(*(long *)((long)&(pMVar1->super_FabArray<amrex::FArrayBox>).
                                        super_FabArrayBase + lVar7) + 0x10))
                    ((long)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar7,
                     (BoxArray *)
                     ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8),
                     (DistributionMapping *)
                     ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x70),1
                     ,0,&local_58,
                     (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      )(ppMVar2[uVar5]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                    );
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
        }
        amrex::MultiFab::Copy
                  ((MultiFab *)
                   ((long)&(((this->m_divu).
                             super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             _M_impl.super__Vector_impl_data._M_start)->
                           super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar7),
                   (a_divu->
                   super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                   super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5],0,0,1,0);
      }
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x180;
    } while ((uVar6 & 0x7fffffff) != uVar5);
  }
  return;
}

Assistant:

void MacProjector::setDivU(const Vector<MultiFab const*>& a_divu)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(
        m_linop != nullptr,
        "MacProjector::setDivU: initProjector must be called before calling this method");

    for (int ilev = 0, N = a_divu.size(); ilev < N; ++ilev) {
        if (a_divu[ilev]) {
            if (!m_divu[ilev].ok()) {
#ifdef AMREX_USE_EB
                m_divu[ilev].define(
                    a_divu[ilev]->boxArray(),
                    a_divu[ilev]->DistributionMap(),
                    1,0,MFInfo(), a_divu[ilev]->Factory());
#else
                m_divu[ilev].define(
                    a_divu[ilev]->boxArray(),
                    a_divu[ilev]->DistributionMap(), 1, 0);
#endif
            }
            MultiFab::Copy(m_divu[ilev], *a_divu[ilev], 0, 0, 1, 0);
        }
    }
}